

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

bfile_t * bf_create_r(char *filename)

{
  FILE *pFVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  stat buf;
  FILE *file;
  bfile_t *bfile;
  uint32_t in_stack_ffffffffffffff64;
  size_t local_78;
  bfile_t *local_10;
  
  local_10 = (bfile_t *)0x0;
  pFVar1 = fopen(in_RDI,"rb");
  if (pFVar1 != (FILE *)0x0) {
    local_10 = create_bfile_t(in_stack_ffffffffffffff64);
    local_10->file = (FILE *)pFVar1;
    sVar2 = strlen(in_RDI);
    pcVar3 = (char *)malloc(sVar2 + 1);
    local_10->filename = pcVar3;
    strcpy(local_10->filename,in_RDI);
    stat(in_RDI,(stat *)&stack0xffffffffffffff58);
    local_10->size = local_78;
    local_10->flags = local_10->flags | 0x100;
  }
  return local_10;
}

Assistant:

bfile_t *
bf_create_r(
    const char * filename )
{
    bfile_t * bfile;
    FILE * file;
    struct stat buf;

    bfile = NULL;
    file = fopen( filename, "rb" );
    if ( file ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        stat( filename, &buf );
        bfile->size = buf.st_size;
        bfile->flags |= BF_READABLE;
    }

    return bfile;
}